

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O3

int QInputDialog::getInt
              (QWidget *parent,QString *title,QString *label,int value,int min,int max,int step,
              bool *ok,WindowFlags flags)

{
  QInputDialogPrivate *pQVar1;
  QSpinBox *this;
  int iVar2;
  QWidget *this_00;
  Data *pDVar3;
  long in_FS_OFFSET;
  QAutoPointer<QInputDialog> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)operator_new(0x28);
  QInputDialog((QInputDialog *)this_00,parent,flags);
  pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_00);
  local_48.o.wp.d = pDVar3;
  local_48.o.wp.value = (QObject *)this_00;
  QWidget::setWindowTitle(this_00,title);
  setLabelText((QInputDialog *)this_00,label);
  pQVar1 = *(QInputDialogPrivate **)&this_00->field_0x8;
  QInputDialogPrivate::ensureIntSpinBox(pQVar1);
  QSpinBox::setRange(pQVar1->intSpinBox,min,max);
  setIntValue((QInputDialog *)this_00,value);
  pQVar1 = *(QInputDialogPrivate **)&this_00->field_0x8;
  QInputDialogPrivate::ensureIntSpinBox(pQVar1);
  QSpinBox::setSingleStep(pQVar1->intSpinBox,step);
  iVar2 = (**(code **)(*(long *)this_00 + 0x1a8))(this_00);
  if (ok != (bool *)0x0) {
    *ok = iVar2 != 0;
  }
  if (iVar2 != 0 && *(int *)(pDVar3 + 4) != 0) {
    this = *(QSpinBox **)(*(long *)&this_00->field_0x8 + 0x300);
    if (this == (QSpinBox *)0x0) {
      value = 0;
    }
    else {
      value = QSpinBox::value(this);
    }
  }
  QAutoPointer<QInputDialog>::~QAutoPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return value;
  }
  __stack_chk_fail();
}

Assistant:

int QInputDialog::getInt(QWidget *parent, const QString &title, const QString &label, int value,
                         int min, int max, int step, bool *ok, Qt::WindowFlags flags)
{
    QAutoPointer<QInputDialog> dialog(new QInputDialog(parent, flags));
    dialog->setWindowTitle(title);
    dialog->setLabelText(label);
    dialog->setIntRange(min, max);
    dialog->setIntValue(value);
    dialog->setIntStep(step);

    const int ret = dialog->exec();
    if (ok)
        *ok = !!ret;
    if (bool(dialog) && ret) {
        return dialog->intValue();
    } else {
        return value;
    }
}